

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> * __thiscall
EOPlus::Parser::ParseScopes
          (deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *__return_storage_ptr__,Parser *this
          )

{
  int line_;
  Parser_Token_Server_Base *pPVar1;
  bool bVar2;
  int iVar3;
  const_iterator cVar4;
  Parser_Error *this_00;
  Token *t_00;
  long lVar5;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>_>
  __l;
  allocator<char> local_2b1;
  deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *local_2b0;
  _Any_data local_2a8;
  code *local_298;
  code *local_290;
  string local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  Token t;
  Scope s;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>
  local_138;
  undefined1 local_110 [64];
  undefined1 local_d0 [80];
  Token local_80;
  
  if (ParseScopes()::scope_id_map_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&ParseScopes()::scope_id_map_abi_cxx11_);
    if (iVar3 != 0) {
      t.type = Identifier;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>
      ::pair<const_char_(&)[10],_EOPlus::Scope::Type,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>
                  *)&s,(char (*) [10])"character",&t.type);
      local_220._M_dataplus._M_p._0_4_ = 2;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>
      ::pair<const_char_(&)[4],_EOPlus::Scope::Type,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>
                  *)&s.args.super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl
                     .super__Deque_impl_data._M_start._M_last,(char (*) [4])0x182381,
                 (Type *)&local_220);
      local_240._M_dataplus._M_p._0_4_ = 3;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>
      ::pair<const_char_(&)[4],_EOPlus::Scope::Type,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>
                  *)&s.args.super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl
                     .super__Deque_impl_data._M_finish._M_node,(char (*) [4])0x1828c9,
                 (Type *)&local_240);
      local_260._M_dataplus._M_p._0_4_ = 4;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>
      ::pair<const_char_(&)[6],_EOPlus::Scope::Type,_true>
                (&local_138,(char (*) [6])0x186383,(Type *)&local_260);
      __l._M_len = 4;
      __l._M_array = (iterator)&s;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>_>_>
      ::map(&ParseScopes()::scope_id_map_abi_cxx11_,__l,
            (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_280,(allocator_type *)&local_2b1);
      lVar5 = 0x78;
      do {
        std::__cxx11::string::~string((string *)((long)&s.type + lVar5));
        lVar5 = lVar5 + -0x28;
      } while (lVar5 != -0x28);
      __cxa_atexit(std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>_>_>
                   ::~map,&ParseScopes()::scope_id_map_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&ParseScopes()::scope_id_map_abi_cxx11_);
    }
  }
  local_2b0 = __return_storage_ptr__;
  std::_Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::_Deque_base
            (&__return_storage_ptr__->
              super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>);
  util::variant::variant((variant *)local_110);
  Token::Token(&t,Invalid,(variant *)local_110);
  std::__cxx11::string::~string((string *)(local_110 + 0x10));
  do {
    bVar2 = GetToken(this,&t,1);
    if (!bVar2) {
LAB_0013004d:
      std::__cxx11::string::~string((string *)&t.data.val_string);
      return local_2b0;
    }
    util::variant::GetString_abi_cxx11_((string *)&s,&t.data);
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>_>_>
            ::find(&ParseScopes()::scope_id_map_abi_cxx11_._M_t,(key_type *)&s);
    std::__cxx11::string::~string((string *)&s);
    if ((_Rb_tree_header *)cVar4._M_node ==
        &ParseScopes()::scope_id_map_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
      pPVar1 = (this->tok)._M_t.
               super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
               ._M_t.
               super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
               .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
      Token::Token((Token *)local_d0,&t);
      Parser_Token_Server_Base::PutBack(pPVar1,(Token *)local_d0);
      std::__cxx11::string::~string((string *)(local_d0 + 0x18));
      goto LAB_0013004d;
    }
    Scope::Scope(&s);
    s.type = cVar4._M_node[2]._M_color;
    std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::push_back(local_2b0,&s);
    local_2a8._M_unused._M_object = (void *)0x0;
    local_2a8._8_8_ = 0;
    local_290 = std::
                _Function_handler<bool_(const_EOPlus::Token_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/parse.cpp:194:29)>
                ::_M_invoke;
    local_298 = std::
                _Function_handler<bool_(const_EOPlus::Token_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/parse.cpp:194:29)>
                ::_M_manager;
    bVar2 = GetTokenIf(this,&t,(function<bool_(const_EOPlus::Token_&)> *)&local_2a8,0x40);
    std::_Function_base::~_Function_base((_Function_base *)&local_2a8);
    if (!bVar2) {
      this_00 = (Parser_Error *)__cxa_allocate_exception(0x18);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_260,"Expected \'.\' after scope-identifier.",&local_2b1);
      std::operator+(&local_240,&local_260," Got: ");
      Token::Token(&local_80,
                   &((this->tok)._M_t.
                     super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                     .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl)
                    ->reject_token);
      token_got_string_abi_cxx11_(&local_280,(EOPlus *)&local_80,t_00);
      std::operator+(&local_220,&local_240,&local_280);
      pPVar1 = (this->tok)._M_t.
               super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
               ._M_t.
               super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
               .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
      iVar3 = pPVar1->line;
      line_ = pPVar1->reject_line;
      if (line_ < iVar3) {
        line_ = iVar3;
      }
      Parser_Error::Parser_Error(this_00,&local_220,line_);
      __cxa_throw(this_00,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::deque<util::variant,_std::allocator<util::variant>_>::~deque(&s.args);
  } while( true );
}

Assistant:

std::deque<Scope> Parser::ParseScopes()
	{
		static const std::map<std::string, Scope::Type> scope_id_map{
			{"character", Scope::Character},
			{"npc", Scope::NPC},
			{"map", Scope::Map},
			{"world", Scope::World}
		};

		std::deque<Scope> scopes;
		Token t;

		while (this->GetToken(t, Token::Identifier))
		{
			auto it = scope_id_map.find(std::string(t.data));

			if (it == scope_id_map.end())
			{
				this->tok->PutBack(t);
				return scopes;
			}

			Scope s;
			s.type = it->second;

			scopes.push_back(s);

			if (!this->GetTokenIf(t, [](const Token& t) { return std::string(t.data) == "."; }, Token::Symbol))
				PARSER_ERROR_GOT("Expected '.' after scope-identifier.");
		}

		return scopes;
	}